

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecMult.c
# Opt level: O1

word Extra_TruthCanonNPN3(word uTruth,int nVars,Vec_Wrd_t *vRes)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  int *__ptr;
  int *__ptr_00;
  long lVar5;
  ulong uVar6;
  word *pwVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  
  uVar14 = 1 << ((byte)nVars & 0x1f);
  uVar4 = Extra_Factorial(nVars);
  __ptr = Extra_GreyCodeSchedule(nVars);
  __ptr_00 = Extra_PermSchedule(nVars);
  vRes->nSize = 0;
  if ((int)uVar14 < 2) {
    uVar14 = 1;
  }
  uVar12 = 0xffffffffffffffff;
  lVar5 = 0;
  do {
    uVar6 = -lVar5 ^ uTruth;
    uVar11 = uVar6;
    if (0 < (int)uVar4) {
      uVar15 = 0;
      do {
        uVar10 = uVar11;
        if (nVars != 0x1f) {
          uVar9 = 0;
          do {
            if (uVar10 <= uVar12) {
              uVar12 = uVar10;
            }
            uVar1 = vRes->nSize;
            if (0 < (long)(int)uVar1) {
              lVar8 = 0;
              do {
                if (vRes->pArray[lVar8] == uVar10) goto LAB_00674a0e;
                lVar8 = lVar8 + 1;
              } while ((int)uVar1 != lVar8);
            }
            uVar2 = vRes->nCap;
            if (uVar1 == uVar2) {
              if ((int)uVar2 < 0x10) {
                if (vRes->pArray == (word *)0x0) {
                  pwVar7 = (word *)malloc(0x80);
                }
                else {
                  pwVar7 = (word *)realloc(vRes->pArray,0x80);
                }
                vRes->pArray = pwVar7;
                iVar13 = 0x10;
              }
              else {
                iVar13 = uVar2 * 2;
                if (iVar13 <= (int)uVar2) goto LAB_006749fc;
                if (vRes->pArray == (word *)0x0) {
                  pwVar7 = (word *)malloc((ulong)uVar2 << 4);
                }
                else {
                  pwVar7 = (word *)realloc(vRes->pArray,(ulong)uVar2 << 4);
                }
                vRes->pArray = pwVar7;
              }
              if (pwVar7 == (word *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                              ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
              }
              vRes->nCap = iVar13;
            }
LAB_006749fc:
            iVar13 = vRes->nSize;
            vRes->nSize = iVar13 + 1;
            vRes->pArray[iVar13] = uVar10;
LAB_00674a0e:
            bVar3 = (byte)(1L << ((byte)__ptr[uVar9] & 0x3f));
            uVar10 = (s_Truths6[__ptr[uVar9]] & uVar10) >> (bVar3 & 0x3f) |
                     uVar10 << (bVar3 & 0x3f) & s_Truths6[__ptr[uVar9]];
            uVar9 = uVar9 + 1;
          } while (uVar9 != uVar14);
        }
        if (uVar11 != uVar10) {
          __assert_fail("tTemp2 == tCur",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecMult.c"
                        ,0xb9,"word Extra_TruthCanonNPN3(word, int, Vec_Wrd_t *)");
        }
        iVar13 = __ptr_00[uVar15];
        bVar3 = (byte)(1L << ((byte)iVar13 & 0x3f));
        uVar11 = (uVar10 & s_PMasks[iVar13][2]) >> (bVar3 & 0x3f) |
                 (s_PMasks[iVar13][1] & uVar10) << (bVar3 & 0x3f) | s_PMasks[iVar13][0] & uVar10;
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar4);
    }
    if (uVar6 != uVar11) {
      __assert_fail("tTemp1 == tCur",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecMult.c"
                    ,0xbc,"word Extra_TruthCanonNPN3(word, int, Vec_Wrd_t *)");
    }
    bVar16 = lVar5 != 0;
    lVar5 = lVar5 + 1;
    if (bVar16) {
      if (__ptr != (int *)0x0) {
        free(__ptr);
      }
      if (__ptr_00 != (int *)0x0) {
        free(__ptr_00);
      }
      return uVar12;
    }
  } while( true );
}

Assistant:

word Extra_TruthCanonNPN3( word uTruth, int nVars, Vec_Wrd_t * vRes )
{
    int nMints  = (1 << nVars);
    int nPerms  = Extra_Factorial( nVars );
    int * pComp = Extra_GreyCodeSchedule( nVars );
    int * pPerm = Extra_PermSchedule( nVars );
    word tCur, tTemp1, tTemp2;
    word uTruthMin = ABC_CONST(0xFFFFFFFFFFFFFFFF);
    int i, p, c;
    Vec_WrdClear( vRes );
    for ( i = 0; i < 2; i++ )
    {
        tCur = i ? ~uTruth : uTruth;
        tTemp1 = tCur;
        for ( p = 0; p < nPerms; p++ )
        {
            tTemp2 = tCur;
            for ( c = 0; c < nMints; c++ )
            {
                if ( uTruthMin > tCur )
                    uTruthMin = tCur;
                Vec_WrdPushUnique( vRes, tCur );
                tCur = Abc_Tt6Flip( tCur, pComp[c] );
            }
            assert( tTemp2 == tCur );
            tCur = Abc_Tt6SwapAdjacent( tCur, pPerm[p] );
        }
        assert( tTemp1 == tCur );
    }
    ABC_FREE( pComp );
    ABC_FREE( pPerm );
    return uTruthMin;
}